

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.cpp
# Opt level: O3

Light * rw::Light::streamRead(Stream *stream)

{
  bool bVar1;
  Light *this;
  uint32 version;
  LightChunkData buf;
  uint local_2c;
  float32 local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  float local_18;
  uint8 local_14;
  ushort local_12;
  
  bVar1 = findChunk(stream,1,(uint32 *)0x0,&local_2c);
  if (bVar1) {
    Stream::read32(stream,&local_28,0x18);
    this = create((uint)local_12);
    if (this != (Light *)0x0) {
      this->radius = local_28;
      (this->color).red = (float32)fStack_24;
      (this->color).green = (float32)fStack_20;
      (this->color).blue = (float32)fStack_1c;
      (this->object).object.privateFlags = -(fStack_20 == fStack_24) & -(fStack_1c == fStack_24) & 1
      ;
      if (local_2c < 0x30300) {
        local_18 = -1.0 / SQRT(local_18 * local_18 + 1.0);
      }
      this->minusCosAngle = (float32)local_18;
      (this->object).object.flags = local_14;
      bVar1 = PluginList::streamRead((PluginList *)&s_plglist,stream,this);
      if (bVar1) {
        return this;
      }
      destroy(this);
    }
  }
  else {
    streamRead();
  }
  return (Light *)0x0;
}

Assistant:

Light*
Light::streamRead(Stream *stream)
{
	uint32 version;
	LightChunkData buf;

	if(!findChunk(stream, ID_STRUCT, nil, &version)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	stream->read32(&buf, sizeof(LightChunkData));
	Light *light = Light::create(buf.type_flags>>16);
	if(light == nil)
		return nil;
	light->radius = buf.radius;
	light->setColor(buf.red, buf.green, buf.blue);
	float32 a = buf.minusCosAngle;
	if(version >= 0x30300)
		light->minusCosAngle = a;
	else
		// tan -> -cos
		light->minusCosAngle = -1.0f/sqrtf(a*a+1.0f);
	light->object.object.flags = (uint8)buf.type_flags;
	if(s_plglist.streamRead(stream, light))
		return light;
	light->destroy();
	return nil;
}